

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int wait_ms(int timeout_ms)

{
  int iVar1;
  uint *puVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  timeval older;
  timeval newer;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar5 = -1;
  }
  else {
    older = curlx_tvnow();
    iVar5 = timeout_ms;
    do {
      iVar1 = poll((pollfd *)0x0,0,iVar5);
      if (iVar1 != -1) break;
      puVar2 = (uint *)__errno_location();
      if ((*puVar2 & 0xfffffffb) != 0) break;
      newer = curlx_tvnow();
      lVar3 = curlx_tvdiff(newer,older);
      iVar5 = timeout_ms - (int)lVar3;
    } while (iVar5 != 0 && (int)lVar3 <= timeout_ms);
    iVar5 = -(uint)(iVar1 != 0);
  }
  return iVar5;
}

Assistant:

int wait_ms(int timeout_ms)
{
#if !defined(MSDOS) && !defined(USE_WINSOCK)
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
#endif
  struct timeval initial_tv;
  int pending_ms;
  int error;
#endif
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    errno = EINVAL;
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(USE_WINSOCK)
  Sleep(timeout_ms);
#else
  pending_ms = timeout_ms;
  initial_tv = curlx_tvnow();
  do {
#if defined(HAVE_POLL_FINE)
    r = poll(NULL, 0, pending_ms);
#else
    pending_tv.tv_sec = pending_ms / 1000;
    pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    r = select(0, NULL, NULL, NULL, &pending_tv);
#endif /* HAVE_POLL_FINE */
    if(r != -1)
      break;
    error = errno;
    if(error && (error != EINTR))
      break;
    pending_ms = timeout_ms - (int)curlx_tvdiff(curlx_tvnow(), initial_tv);
    if(pending_ms <= 0)
      break;
  } while(r == -1);
#endif /* USE_WINSOCK */
  if(r)
    r = -1;
  return r;
}